

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrc.c
# Opt level: O1

UInt32 CrcUpdateT1(UInt32 v,void *data,size_t size,UInt32 *table)

{
  ulong uVar1;
  Byte *p;
  size_t sVar2;
  
  uVar1 = (ulong)v;
  if (size != 0) {
    sVar2 = 0;
    do {
      v = (uint)(uVar1 >> 8) ^ table[(byte)(*(byte *)((long)data + sVar2) ^ (byte)uVar1)];
      uVar1 = (ulong)v;
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  return v;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT1(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  const Byte *pEnd = p + size;
  for (; p != pEnd; p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}